

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::prepareAttributes
          (TextureTestBase *this,GLuint test_case_index,ProgramInterface *program_interface,
          Buffer *buffer,VertexArray *vao)

{
  GLuint GVar1;
  Variable *pVVar2;
  bool bVar3;
  pointer data;
  Buffer *pBVar4;
  int iVar5;
  pointer ppVVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ulong local_50;
  Buffer *local_48;
  Type local_40;
  
  iVar5 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0x1f]
          )();
  Utils::VertexArray::Bind(vao);
  Utils::Buffer::Bind(buffer);
  ppVVar6 = (program_interface->m_vertex).m_inputs.
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(program_interface->m_vertex).m_inputs.
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar6;
  if (lVar7 != 0) {
    uVar8 = 0;
    uVar9 = 0;
    do {
      pVVar2 = ppVVar6[uVar8];
      uVar10 = (pVVar2->m_descriptor).m_offset + (int)pVVar2->m_data_size;
      if ((int)uVar10 < (int)uVar9) {
        uVar10 = uVar9;
      }
      uVar9 = uVar10;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < (ulong)(lVar7 >> 3));
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar8 = (ulong)uVar9;
    local_48 = buffer;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,uVar8);
    data = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    ppVVar6 = (program_interface->m_vertex).m_inputs.
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_50 = uVar8;
    if ((program_interface->m_vertex).m_inputs.
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVVar6) {
      uVar8 = 0;
      uVar11 = 1;
      do {
        pVVar2 = ppVVar6[uVar8];
        memcpy(data + (pVVar2->m_descriptor).m_offset,pVVar2->m_data,pVVar2->m_data_size);
        if ((char)iVar5 == '\0') {
          GVar1 = (pVVar2->m_descriptor).m_n_array_elements;
          Utils::VertexArray::Attribute
                    (vao,(pVVar2->m_descriptor).m_expected_location,
                     &(pVVar2->m_descriptor).field_9.m_builtin,GVar1,
                     (pVVar2->m_descriptor).m_normalized,
                     (GVar1 + (GVar1 == 0)) * (pVVar2->m_descriptor).m_expected_stride_of_element,
                     (GLvoid *)(ulong)(pVVar2->m_descriptor).m_offset);
        }
        else if ((pVVar2->m_descriptor).m_expected_component == 0) {
          local_40._0_8_ =
               (ulong)(pVVar2->m_descriptor).field_9.m_builtin.m_basic_type | 0x100000000;
          local_40.m_n_rows = 4;
          GVar1 = (pVVar2->m_descriptor).m_n_array_elements;
          Utils::VertexArray::Attribute
                    (vao,(pVVar2->m_descriptor).m_expected_location,&local_40,GVar1,
                     (pVVar2->m_descriptor).m_normalized,
                     (GVar1 + (GVar1 == 0)) * (pVVar2->m_descriptor).m_expected_stride_of_element,
                     (GLvoid *)(ulong)(pVVar2->m_descriptor).m_offset);
        }
        ppVVar6 = (program_interface->m_vertex).m_inputs.
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar11 < (ulong)((long)(program_interface->m_vertex).m_inputs.
                                       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar6 >>
                                3);
        uVar8 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar3);
    }
    pBVar4 = local_48;
    iVar5 = (*local_48->m_context->m_renderCtx->_vptr_RenderContext[3])();
    Utils::Buffer::Data((Functions *)CONCAT44(extraout_var,iVar5),pBVar4->m_buffer,StaticDraw,
                        local_50,data);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void TextureTestBase::prepareAttributes(GLuint test_case_index, Utils::ProgramInterface& program_interface,
										Utils::Buffer& buffer, Utils::VertexArray& vao)
{
	bool use_component_qualifier = useComponentQualifier(test_case_index);

	/* Get shader interface */
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Bind vao and buffer */
	vao.Bind();
	buffer.Bind();

	/* Skip if there are no input variables in vertex shader */
	if (0 == si.m_inputs.size())
	{
		return;
	}

	/* Calculate vertex stride and check */
	GLint vertex_stride = 0;

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		Utils::Variable& variable = *si.m_inputs[i];

		GLint variable_size = static_cast<GLuint>(variable.m_data_size);

		GLint ends_at = variable_size + variable.m_descriptor.m_offset;

		vertex_stride = std::max(vertex_stride, ends_at);
	}

	/* Prepare buffer data and set up vao */
	std::vector<GLubyte> buffer_data;
	buffer_data.resize(vertex_stride);

	GLubyte* ptr = &buffer_data[0];

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		Utils::Variable& variable = *si.m_inputs[i];

		memcpy(ptr + variable.m_descriptor.m_offset, variable.m_data, variable.m_data_size);

		if (false == use_component_qualifier)
		{
			vao.Attribute(variable.m_descriptor.m_expected_location, variable.m_descriptor.m_builtin,
						  variable.m_descriptor.m_n_array_elements, variable.m_descriptor.m_normalized,
						  variable.GetStride(), (GLvoid*)(intptr_t)variable.m_descriptor.m_offset);
		}
		else if (0 == variable.m_descriptor.m_expected_component)
		{
			/* Components can only be applied to vectors.
			 Assumption that test use all 4 components */
			const Utils::Type& type =
				Utils::Type::GetType(variable.m_descriptor.m_builtin.m_basic_type, 1 /* n_columns */, 4 /* n_rows */);

			vao.Attribute(variable.m_descriptor.m_expected_location, type, variable.m_descriptor.m_n_array_elements,
						  variable.m_descriptor.m_normalized, variable.GetStride(),
						  (GLvoid*)(intptr_t)variable.m_descriptor.m_offset);
		}
	}

	/* Update buffer */
	buffer.Data(Utils::Buffer::StaticDraw, vertex_stride, ptr);
}